

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_time.c
# Opt level: O0

int pt_time_query_cbr(uint32_t *cbr,pt_time *time)

{
  pt_time *time_local;
  uint32_t *cbr_local;
  
  if ((cbr == (uint32_t *)0x0) || (time == (pt_time *)0x0)) {
    cbr_local._4_4_ = -1;
  }
  else if (((byte)time->field_0x29 >> 1 & 1) == 0) {
    cbr_local._4_4_ = -0x10;
  }
  else {
    *cbr = (uint)time->cbr;
    cbr_local._4_4_ = 0;
  }
  return cbr_local._4_4_;
}

Assistant:

int pt_time_query_cbr(uint32_t *cbr, const struct pt_time *time)
{
	if (!cbr || !time)
		return -pte_internal;

	if (!time->have_cbr)
		return -pte_no_cbr;

	*cbr = time->cbr;

	return 0;
}